

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kernel_type.hpp
# Opt level: O1

void __thiscall
ExchCXX::detail::BuiltinKernelImpl<ExchCXX::BuiltinSCANL_C,void>::
eval_exc_inc_<double&,int&,double_const*&,double_const*&,double_const*&,double_const*&,double*&>
          (BuiltinKernelImpl<ExchCXX::BuiltinSCANL_C,void> *this,double *args,int *args_1,
          double **args_2,double **args_3,double **args_4,double **args_5,double **args_6)

{
  uint N;
  const_host_buffer_type rho;
  const_host_buffer_type sigma;
  const_host_buffer_type lapl;
  host_buffer_type eps;
  ulong uVar1;
  double sigma_00;
  double dVar2;
  double rho_00;
  double dStack_60;
  double dStack_58;
  double dStack_50;
  double dStack_48;
  double dStack_40;
  double dStack_38;
  
  dStack_48 = *args;
  N = *args_1;
  rho = *args_2;
  sigma = *args_3;
  lapl = *args_4;
  eps = *args_6;
  if (*(int *)(this + 8) == 0) {
    host_eval_exc_inc_helper_polar<ExchCXX::BuiltinSCANL_C>(dStack_48,N,rho,sigma,lapl,*args_5,eps);
    return;
  }
  if (0 < (int)N) {
    uVar1 = 0;
    do {
      rho_00 = rho[uVar1];
      dStack_38 = lapl[uVar1];
      dVar2 = sigma[uVar1];
      dStack_40 = 1.0000000000000052e-40;
      if (1.0000000000000052e-40 <= dVar2) {
        dStack_40 = dVar2;
      }
      if (rho_00 <= 1e-15) {
        dStack_60 = 0.0;
      }
      else {
        dStack_50 = rho_00;
        kernel_traits<ExchCXX::BuiltinPC07OPT_K>::eval_exc_unpolar_impl
                  (rho_00,dStack_40,dStack_38,0.0,&dStack_60);
        rho_00 = dStack_50;
      }
      dStack_60 = dStack_60 * rho_00;
      if (rho_00 <= 1e-15) {
        dStack_58 = 0.0;
      }
      else {
        dVar2 = 1e-20;
        if (1e-20 <= dStack_60) {
          dVar2 = dStack_60;
        }
        sigma_00 = rho_00 * 8.0 * dVar2;
        if (dStack_40 <= sigma_00) {
          sigma_00 = dStack_40;
        }
        kernel_traits<ExchCXX::BuiltinSCAN_C>::eval_exc_unpolar_impl
                  (rho_00,sigma_00,dStack_38,dVar2,&dStack_58);
      }
      eps[uVar1] = dStack_58 * dStack_48 + eps[uVar1];
      uVar1 = uVar1 + 1;
    } while (N != uVar1);
  }
  return;
}

Assistant:

void eval_exc_inc_(Args&&... args) const {
    if( is_polarized() )
      host_eval_exc_inc_helper_polar<KernelType>(
        std::forward<Args>(args)...
      );
    else
      host_eval_exc_inc_helper_unpolar<KernelType>(
        std::forward<Args>(args)...
      );
  }